

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O1

void __thiscall
duckdb::FileSystem::RegisterSubSystem
          (FileSystem *this,FileCompressionType compression_type,
          unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> sub_fs)

{
  NotImplementedException *this_00;
  undefined7 in_register_00000031;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = (NotImplementedException *)
            __cxa_allocate_exception(0x10,CONCAT71(in_register_00000031,compression_type));
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"%s: Can\'t register a sub system on a non-virtual file system","")
  ;
  (*this->_vptr_FileSystem[0x27])(&local_40,this);
  NotImplementedException::NotImplementedException<std::__cxx11::string>
            (this_00,&local_60,&local_40);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void FileSystem::RegisterSubSystem(FileCompressionType compression_type, unique_ptr<FileSystem> sub_fs) {
	throw NotImplementedException("%s: Can't register a sub system on a non-virtual file system", GetName());
}